

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObject_private.hh
# Opt level: O0

shared_ptr<QPDFObject> __thiscall
QPDFObject::create<QPDF_Stream,QPDFObjectHandle,unsigned_long&>
          (QPDFObject *this,QPDF *qpdf,QPDFObjGen og,QPDFObjectHandle *args,unsigned_long *args_1)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<QPDFObject> sVar1;
  QPDFObjectHandle local_48;
  QPDF_Stream local_38;
  size_t *local_30;
  unsigned_long *args_local_1;
  QPDFObjectHandle *args_local;
  QPDF *qpdf_local;
  QPDFObjGen og_local;
  
  local_30 = args_1;
  args_local_1 = (unsigned_long *)args;
  args_local = (QPDFObjectHandle *)qpdf;
  qpdf_local = (QPDF *)og;
  og_local = (QPDFObjGen)this;
  QPDFObjectHandle::QPDFObjectHandle(&local_48,args);
  QPDF_Stream::QPDF_Stream(&local_38,&local_48,*local_30);
  std::make_shared<QPDFObject,QPDF*&,QPDFObjGen&,QPDF_Stream>
            ((QPDF **)this,(QPDFObjGen *)&args_local,(QPDF_Stream *)&qpdf_local);
  QPDF_Stream::~QPDF_Stream(&local_38);
  QPDFObjectHandle::~QPDFObjectHandle(&local_48);
  sVar1.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<QPDFObject>)sVar1.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

inline static std::shared_ptr<QPDFObject>
    create(QPDF* qpdf, QPDFObjGen og, Args&&... args)
    {
        return std::make_shared<QPDFObject>(
            qpdf, og, std::forward<T>(T(std::forward<Args>(args)...)));
    }